

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wdgl.cpp
# Opt level: O1

int __thiscall rw::wdgl::ObjPipeline::init(ObjPipeline *this,EVP_PKEY_CTX *ctx)

{
  rw::ObjPipeline::init(&this->super_ObjPipeline,(EVP_PKEY_CTX *)0xc);
  this->numCustomAttribs = 0;
  (this->super_ObjPipeline).impl.instance = instance;
  (this->super_ObjPipeline).impl.uninstance = uninstance;
  this->instanceCB = (_func_uint32_Geometry_ptr_int32_uint32 *)0x0;
  this->uninstanceCB = (_func_void_Geometry_ptr *)0x0;
  return 0x119b89;
}

Assistant:

void
ObjPipeline::init(void)
{
	this->rw::ObjPipeline::init(PLATFORM_GL3);
	this->numCustomAttribs = 0;
	this->impl.instance = wdgl::instance;
	this->impl.uninstance = wdgl::uninstance;
	this->instanceCB = nil;
	this->uninstanceCB = nil;
}